

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::echo(TestMoreStuffImpl *this,EchoContext context)

{
  Client local_c0 [2];
  Maybe<capnp::MessageSize> local_90;
  undefined1 local_78 [8];
  Builder result;
  Reader params;
  TestMoreStuffImpl *this_local;
  EchoContext context_local;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  context_local.hook = (CallContextHook *)this;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
  ::getParams((Reader *)&result._builder.dataSize,
              (CallContext<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
               *)&this_local);
  kj::Maybe<capnp::MessageSize>::Maybe();
  CallContext<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
  ::getResults((Builder *)local_78,
               (CallContext<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
                *)&this_local,&local_90);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_90);
  capnproto_test::capnp::test::TestMoreStuff::EchoParams::Reader::getCap
            (local_c0,(Reader *)&result._builder.dataSize);
  capnproto_test::capnp::test::TestMoreStuff::EchoResults::Builder::setCap
            ((Builder *)local_78,local_c0);
  capnproto_test::capnp::test::TestCallOrder::Client::~Client(local_c0);
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::echo(EchoContext context) {
  ++callCount;
  auto params = context.getParams();
  auto result = context.getResults();
  result.setCap(params.getCap());
  return kj::READY_NOW;
}